

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_ce22::BlockCopy<sptk::uint24_t>::Run
          (BlockCopy<sptk::uint24_t> *this,istream *input_stream)

{
  uint write_size;
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint8_t *puVar4;
  char *__nptr;
  pointer puVar5;
  bool bVar6;
  uint write_size_00;
  uint uVar7;
  int *piVar8;
  undefined8 uVar9;
  ostream *poVar10;
  uint8_t *puVar11;
  long lVar12;
  uint uVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> input_data;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> pad_data;
  char *local_98;
  long local_90;
  char local_88 [16];
  uint8_t *local_78;
  long local_70;
  char *local_68;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_60;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_48;
  
  uVar13 = this->input_end_number_ - this->input_start_number_;
  write_size = this->output_start_number_;
  write_size_00 = (~uVar13 - write_size) + this->output_block_length_;
  uVar7 = write_size_00;
  if ((int)write_size_00 < (int)write_size) {
    uVar7 = write_size;
  }
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&local_48,(long)(int)uVar7,&this->pad_value_,(allocator_type *)&local_98);
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&local_60,(long)this->input_block_length_,(allocator_type *)&local_98);
  puVar5 = local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->is_ascii_ == false) {
    do {
      bVar6 = sptk::ReadStream<sptk::uint24_t>
                        (false,0,0,this->input_block_length_,&local_60,input_stream,(int *)0x0);
      if (!bVar6) goto LAB_00107f16;
    } while (((((int)write_size < 1) ||
              (bVar6 = sptk::WriteStream<sptk::uint24_t>
                                 (0,write_size,&local_48,(ostream *)&std::cout,(int *)0x0), bVar6))
             && (bVar6 = sptk::WriteStream<sptk::uint24_t>
                                   (this->input_start_number_,uVar13 + 1,&local_60,
                                    (ostream *)&std::cout,(int *)0x0), bVar6)) &&
            (((int)write_size_00 < 1 ||
             (bVar6 = sptk::WriteStream<sptk::uint24_t>
                                (0,write_size_00,&local_48,(ostream *)&std::cout,(int *)0x0), bVar6)
             )));
  }
  else {
    local_70 = (long)(int)write_size_00;
    local_78 = (local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl
                .super__Vector_impl_data._M_start)->value + 2;
    puVar4 = (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
              super__Vector_impl_data._M_start)->value;
    bVar6 = false;
    while (!bVar6) {
      if (this->input_block_length_ < 1) {
        bVar3 = true;
      }
      else {
        lVar12 = 0;
        puVar11 = local_78;
        do {
          local_98 = local_88;
          local_90 = 0;
          local_88[0] = '\0';
          std::operator>>(input_stream,(string *)&local_98);
          __nptr = local_98;
          bVar3 = false;
          if (local_90 == 0) {
            bVar3 = true;
            bVar6 = true;
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if ((this->input_start_number_ <= lVar12) && (lVar12 <= this->input_end_number_)) {
              piVar8 = __errno_location();
              iVar1 = *piVar8;
              *piVar8 = 0;
              strtold(__nptr,&local_68);
              if (local_68 == __nptr) {
                uVar9 = std::__throw_invalid_argument("stold");
LAB_00107f50:
                if (local_98 != local_88) {
                  operator_delete(local_98);
                }
                if (local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_60.
                                  super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                _Unwind_Resume(uVar9);
              }
              if (*piVar8 == 0) {
                *piVar8 = iVar1;
              }
              else if (*piVar8 == 0x22) {
                uVar9 = std::__throw_out_of_range("stold");
                goto LAB_00107f50;
              }
              iVar1 = (int)ROUND(in_ST0);
              ((uint24_t *)(puVar11 + -2))->value[0] = (uint8_t)iVar1;
              puVar11[-1] = (uint8_t)((uint)iVar1 >> 8);
              *puVar11 = (uint8_t)((uint)iVar1 >> 0x10);
              bVar3 = false;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
              in_ST5 = in_ST6;
              in_ST6 = in_ST7;
            }
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          if (!bVar2) goto LAB_00107d0e;
          lVar12 = lVar12 + 1;
          puVar11 = puVar11 + 3;
        } while (lVar12 < this->input_block_length_);
        bVar3 = true;
      }
LAB_00107d0e:
      if (!bVar3) goto LAB_00107f0e;
      if (bVar6) break;
      if (0 < (int)write_size) {
        lVar12 = 0;
        do {
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (&std::cout,
                               (uint)puVar5->value[lVar12] |
                               (uint)puVar5->value[lVar12 + 1] << 8 |
                               (uint)(puVar4 + 2)[lVar12] << 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          lVar12 = lVar12 + 3;
        } while ((ulong)write_size * 3 != lVar12);
      }
      iVar1 = this->input_start_number_;
      if (iVar1 <= this->input_end_number_) {
        lVar12 = (long)iVar1 + -1;
        puVar11 = local_78 + (long)iVar1 * 3;
        do {
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 0x13;
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (&std::cout,
                               (uint)((uint24_t *)(puVar11 + -2))->value[0] |
                               (uint)puVar11[-1] << 8 | (uint)*puVar11 << 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          lVar12 = lVar12 + 1;
          puVar11 = puVar11 + 3;
        } while (lVar12 < this->input_end_number_);
      }
      if (0 < (int)write_size_00) {
        lVar12 = 0;
        puVar11 = puVar4 + 2;
        do {
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (&std::cout,
                               (uint)((uint24_t *)(puVar11 + -2))->value[0] |
                               (uint)puVar11[-1] << 8 | (uint)*puVar11 << 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          lVar12 = lVar12 + 1;
          puVar11 = puVar11 + 3;
        } while (lVar12 < local_70);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
    bVar3 = false;
LAB_00107f0e:
    if (!bVar3) {
LAB_00107f16:
      bVar6 = true;
      goto LAB_00107f18;
    }
  }
  bVar6 = false;
LAB_00107f18:
  if (local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }